

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::EnvClone::EnvClone
          (EnvClone *this,Environment *parent,Parameters *deviceParams,deUint32 maxResourceConsumers
          )

{
  PlatformInterface *vkp_;
  RefData<vk::VkDevice_s_*> data;
  VkDevice_s **ppVVar1;
  Move<vk::VkDevice_s_*> local_58;
  RefData<vk::VkDevice_s_*> local_40;
  deUint32 local_24;
  Parameters *pPStack_20;
  deUint32 maxResourceConsumers_local;
  Parameters *deviceParams_local;
  Environment *parent_local;
  EnvClone *this_local;
  
  local_24 = maxResourceConsumers;
  pPStack_20 = deviceParams;
  deviceParams_local = (Parameters *)parent;
  parent_local = (Environment *)this;
  Device::Resources::Resources(&this->deviceRes,parent,deviceParams);
  Device::create(&local_58,(Environment *)deviceParams_local,&this->deviceRes,pPStack_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_58);
  data.deleter.m_destroyDevice._0_4_ = (int)local_40.deleter.m_destroyDevice;
  data.object = local_40.object;
  data.deleter.m_destroyDevice._4_4_ = (int)((ulong)local_40.deleter.m_destroyDevice >> 0x20);
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique(&this->device,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_58);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->device).super_RefBase<vk::VkDevice_s_*>);
  ::vk::DeviceDriver::DeviceDriver
            (&this->vkd,&(this->deviceRes).vki.super_InstanceInterface,*ppVVar1);
  vkp_ = *(PlatformInterface **)deviceParams_local;
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      (&(this->device).super_RefBase<vk::VkDevice_s_*>);
  Environment::Environment
            (&this->env,vkp_,&(this->vkd).super_DeviceInterface,*ppVVar1,
             (this->deviceRes).queueFamilyIndex,*(BinaryCollection **)(deviceParams_local + 0x20),
             *(VkAllocationCallbacks **)(deviceParams_local + 0x28),local_24);
  return;
}

Assistant:

EnvClone (const Environment& parent, const Device::Parameters& deviceParams, deUint32 maxResourceConsumers)
		: deviceRes	(parent, deviceParams)
		, device	(Device::create(parent, deviceRes, deviceParams))
		, vkd		(deviceRes.vki, *device)
		, env		(parent.vkp, vkd, *device, deviceRes.queueFamilyIndex, parent.programBinaries, parent.allocationCallbacks, maxResourceConsumers)
	{
	}